

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O1

int lws_ssl_client_connect2(lws *wsi,char *errbuf,int len)

{
  lws_ssl_capable_status lVar1;
  int iVar2;
  uint uVar3;
  
  if ((short)wsi->wsistate == 0x204) {
    lVar1 = lws_tls_client_connect(wsi);
    _lws_log(0x10,"%s: SSL_connect says %d\n","lws_ssl_client_connect2",(ulong)(uint)lVar1);
    uVar3 = 0;
    switch(lVar1) {
    case LWS_SSL_CAPABLE_MORE_SERVICE:
      break;
    case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
      lws_callback_on_writable(wsi);
    case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
      lwsi_set_state(wsi,0x204);
      uVar3 = 0;
      break;
    case LWS_SSL_CAPABLE_ERROR:
      lws_snprintf(errbuf,(long)len,"client connect failed");
      uVar3 = 0xffffffff;
      break;
    default:
      goto switchD_00129fe9_default;
    }
  }
  else {
switchD_00129fe9_default:
    iVar2 = lws_tls_client_confirm_peer_cert(wsi,errbuf,len);
    uVar3 = -(uint)(iVar2 != 0) | 1;
  }
  return uVar3;
}

Assistant:

int
lws_ssl_client_connect2(struct lws *wsi, char *errbuf, int len)
{
	int n;

	if (lwsi_state(wsi) == LRS_WAITING_SSL) {
		n = lws_tls_client_connect(wsi);
		lwsl_debug("%s: SSL_connect says %d\n", __func__, n);

		switch (n) {
		case LWS_SSL_CAPABLE_ERROR:
			lws_snprintf(errbuf, len, "client connect failed");
			return -1;
		case LWS_SSL_CAPABLE_DONE:
			break; /* connected */
		case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
			lws_callback_on_writable(wsi);
			/* fallthru */
		case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
			lwsi_set_state(wsi, LRS_WAITING_SSL);
			/* fallthru */
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			return 0;
		}
	}

	if (lws_tls_client_confirm_peer_cert(wsi, errbuf, len))
		return -1;

	return 1;
}